

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O1

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  MatrixXd *this_00;
  VectorXd *pVVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  Matrix<double,__1,__1,_0,__1,__1> *__ptr;
  DenseIndex DVar7;
  DenseIndex DVar8;
  VectorXd *__ptr_00;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar9;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar10;
  char *__function;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *other;
  float fVar11;
  float fVar12;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_c8;
  float local_a4;
  Scalar local_a0;
  Scalar local_98;
  double local_90;
  Scalar local_88;
  double local_80;
  Scalar local_78;
  Scalar local_70;
  double local_68;
  Scalar local_60;
  double local_58;
  double local_50;
  Scalar local_48;
  double local_40;
  Scalar local_38;
  Scalar local_30;
  
  if (this->is_initialized_ == false) {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_c8,4,4,1);
    pVVar1 = &(this->ekf_).x_;
    __ptr_00 = (VectorXd *)
               (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
    (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = (double *)local_c8.m_xpr;
    DVar7 = (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_c8.m_row;
    local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)__ptr_00;
    local_c8.m_row = DVar7;
    free(__ptr_00);
    if (measurement_pack->sensor_type_ == LASER) {
      lVar2 = (measurement_pack->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (lVar2 < 1) {
LAB_00104791:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x9c,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      pdVar6 = (measurement_pack->raw_measurements_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      local_c8.m_row = 0;
      local_c8.m_col = 1;
      local_c8.m_currentBlockRows = 1;
      *(pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           *pdVar6;
      local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
      if (lVar2 == 1) goto LAB_00104791;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_c8,
                           pdVar6 + 1);
      local_98 = 0.0;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                          (pCVar10,&local_98);
      local_a0 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar10,&local_a0)
      ;
    }
    else {
      if (measurement_pack->sensor_type_ != RADAR) goto LAB_00104739;
      lVar2 = (measurement_pack->raw_measurements_).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (lVar2 < 1) goto LAB_00104791;
      pdVar6 = (measurement_pack->raw_measurements_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      local_c8.m_row = 0;
      local_c8.m_col = 1;
      local_c8.m_currentBlockRows = 1;
      *(pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
           *pdVar6;
      local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
      if (lVar2 == 1) goto LAB_00104791;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_c8,
                           pdVar6 + 1);
      local_98 = 0.0;
      pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                          (pCVar10,&local_98);
      local_a0 = 0.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar10,&local_a0)
      ;
    }
    if ((local_c8.m_currentBlockRows + local_c8.m_row ==
         ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_rows) && (local_c8.m_col == 1)) {
LAB_00104739:
      this->previous_timestamp_ = measurement_pack->timestamp_;
      this->is_initialized_ = true;
      return;
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
    ;
  }
  else {
    lVar2 = measurement_pack->timestamp_;
    lVar3 = this->previous_timestamp_;
    this->previous_timestamp_ = lVar2;
    lVar4 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    if ((lVar4 < 1) ||
       (lVar5 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols, lVar5 < 3)) {
LAB_0010475b:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x151,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                   );
    }
    fVar11 = (float)((double)(lVar2 - lVar3) / 1000000.0);
    pdVar6 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    pdVar6[lVar4 * 2] = (double)fVar11;
    if ((lVar4 == 1) || (lVar5 == 3)) goto LAB_0010475b;
    pdVar6[lVar4 * 3 + 1] = (double)fVar11;
    local_c8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    local_c8.m_row = 0;
    local_c8.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_c8,0x10,4,4);
    local_a4 = fVar11 * fVar11;
    fVar12 = local_a4 * fVar11;
    __ptr = (Matrix<double,__1,__1,_0,__1,__1> *)
            (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_c8.m_xpr;
    DVar7 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_c8.m_row;
    DVar8 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_c8.m_col;
    local_c8.m_xpr = __ptr;
    local_c8.m_row = DVar7;
    local_c8.m_col = DVar8;
    free(__ptr);
    fVar11 = fVar11 * fVar12 * 0.25;
    local_c8.m_row = 0;
    local_c8.m_col = 1;
    local_c8.m_currentBlockRows = 1;
    *(this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = (double)(this->noise_ax * fVar11);
    local_98 = 0.0;
    local_c8.m_xpr = &(this->ekf_).Q_;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (&local_c8,&local_98);
    fVar12 = fVar12 * 0.5;
    local_a0 = (Scalar)(this->noise_ax * fVar12);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_a0);
    local_30 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_30);
    local_38 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_38);
    local_40 = (double)(fVar11 * this->noise_ay);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_40);
    local_48 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_48);
    local_50 = (double)(this->noise_ay * fVar12);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_50);
    local_58 = (double)(this->noise_ax * fVar12);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_58);
    local_60 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_60);
    local_68 = (double)(this->noise_ax * local_a4);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_68);
    local_70 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_70);
    local_78 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_78);
    local_80 = (double)(fVar12 * this->noise_ay);
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_80);
    local_88 = 0.0;
    pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                       (pCVar9,&local_88);
    local_90 = (double)(local_a4 * this->noise_ay);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar9,&local_90);
    if (((local_c8.m_currentBlockRows + local_c8.m_row ==
          ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_rows) ||
        (((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_cols == 0)) &&
       (local_c8.m_col ==
        ((local_c8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_cols)) {
      KalmanFilter::Predict(&this->ekf_);
      this_00 = &(this->ekf_).H_;
      if (measurement_pack->sensor_type_ == RADAR) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_radar_);
        other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_;
      }
      else {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)this_00,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_);
        other = (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_;
      }
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,other);
      KalmanFilter::Update(&this->ekf_,&measurement_pack->raw_measurements_);
      return;
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/basavarajnavalgund[P]tracking-with-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,__function);
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {


  /*****************************************************************************
   *  Initialization
   ****************************************************************************/
  if (!is_initialized_) {

    // first measurement
   // cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);

    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      /**
          Initialize state. cheked
      */

       ekf_.x_ << measurement_pack.raw_measurements_[0], measurement_pack.raw_measurements_[1], 0, 0; // x, y, vx, vy
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      /**
      Initialize state.cheked
      */
      ekf_.x_ << measurement_pack.raw_measurements_[0], measurement_pack.raw_measurements_[1], 0, 0; // x, y, vx, vy
    }


    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing, no need to predict or update
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction (laser)
   ****************************************************************************/

  /**
     * Update the state transition matrix F according to the new elapsed time.
      - Time is measured in seconds.
     * Update the process noise covariance matrix.
     * Use noise_ax = 9 and noise_ay = 9 for your Q matrix.
   */

  // compute the time elapsed between the current and previous measurements (0.05 seconds)
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;  //  in seconds
  previous_timestamp_ = measurement_pack.timestamp_;

// time difference is 0.05 seconds

//dt power of 4, 3,2 need for Q matrix cheked

  float dt_2 = dt * dt;
  float dt_3 = dt_2 * dt;
  float dt_4 = dt_3 * dt;

  // Modify the F matrix so that the time is integrated
  ekf_.F_(0, 2) = dt;
  ekf_.F_(1, 3) = dt;

  //set the process covariance matrix Q  cheked
  ekf_.Q_ = MatrixXd(4, 4);
  ekf_.Q_ << dt_4/4*noise_ax,   0,                dt_3/2*noise_ax,  0,
             0,                 dt_4/4*noise_ay,  0,                dt_3/2*noise_ay,
             dt_3/2*noise_ax,   0,                dt_2*noise_ax,    0,
             0,                 dt_3/2*noise_ay,  0,                dt_2*noise_ay;

  ekf_.Predict();

  /*****************************************************************************
   *  Update
   ****************************************************************************/

  /**
     * Use the sensor type to perform the update step.
     * Update the state and covariance matrices.
   */

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    // Radar updates  cheked
    ekf_.H_ = H_radar_;
    ekf_.R_ = R_radar_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }
  else {
    // Laser updates  cheked
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }

  // print the output
 // cout << "x_ = " << ekf_.x_ << endl;
 // cout << "P_ = " << ekf_.P_ << endl;
}